

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  ulong uVar1;
  
  if (0 < this->length_) {
    uVar1 = (ulong)(this->length_ - 1);
    if (uVar1 < pos) {
      pos = uVar1;
    }
    while (-1 < (int)pos) {
      uVar1 = pos & 0xffffffff;
      pos = (size_type)((int)pos - 1);
      if (this->ptr_[uVar1] == c) {
        return uVar1;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

StringPiece::size_type StringPiece::rfind(char c, size_type pos) const {
  if (length_ <= 0) return npos;
  for (int i = static_cast<int>(min(pos, static_cast<size_type>(length_ - 1)));
       i >= 0; --i) {
    if (ptr_[i] == c) {
      return i;
    }
  }
  return npos;
}